

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O0

int asn1_get_nonzero_mpi(uchar **p,uchar *end,mbedtls_mpi *X)

{
  int iVar1;
  mbedtls_mpi *in_RSI;
  mbedtls_mpi *in_RDI;
  int ret;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = mbedtls_asn1_get_mpi
                    ((uchar **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (uchar *)in_RDI,in_RSI);
  if (iVar1 == 0) {
    iVar1 = mbedtls_mpi_cmp_int(in_RDI,(mbedtls_mpi_sint)in_RSI);
    if (iVar1 == 0) {
      iVar1 = -0x4080;
    }
    else {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int asn1_get_nonzero_mpi(unsigned char **p,
                                const unsigned char *end,
                                mbedtls_mpi *X)
{
    int ret;

    ret = mbedtls_asn1_get_mpi(p, end, X);
    if (ret != 0) {
        return ret;
    }

    if (mbedtls_mpi_cmp_int(X, 0) == 0) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    return 0;
}